

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

ON_DimStyle * __thiscall
ON_DimStyle::CreateOverrideCandidate(ON_DimStyle *__return_storage_ptr__,ON_DimStyle *this)

{
  ON_UUID parent_id_00;
  ON_UUID id;
  bool bVar1;
  ON_UUID *pOVar2;
  ON_DimStyle *parent;
  uchar unaff_RBX [8];
  ON_UUID parent_id;
  ON_UUID_struct local_28;
  undefined8 in_stack_ffffffffffffffe8;
  
  ON_DimStyle(__return_storage_ptr__,this);
  pOVar2 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
  bVar1 = IsOverrideDimStyleCandidate(this,*pOVar2,false,(ON_wString *)0x0);
  if (!bVar1) {
    bVar1 = ON_ModelComponent::ParentIdIsNotNil(&__return_storage_ptr__->super_ON_ModelComponent);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::ParentId(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    else {
      pOVar2 = ON_ModelComponent::Id(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    local_28.Data1 = pOVar2->Data1;
    local_28.Data2 = pOVar2->Data2;
    local_28.Data3 = pOVar2->Data3;
    local_28.Data4 = *&pOVar2->Data4;
    ON_ModelComponent::ClearId(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearName(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearIndex(&__return_storage_ptr__->super_ON_ModelComponent);
    bVar1 = ::operator==(&ON_nil_uuid,&local_28);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
      local_28.Data1 = pOVar2->Data1;
      local_28.Data2 = pOVar2->Data2;
      local_28.Data3 = pOVar2->Data3;
      local_28.Data4 = *&pOVar2->Data4;
    }
    ON_ModelComponent::SetParentId(&__return_storage_ptr__->super_ON_ModelComponent,&local_28);
    if (__return_storage_ptr__->m_field_override_parent_count != 0) {
      id.Data4[0] = unaff_RBX[0];
      id.Data4[1] = unaff_RBX[1];
      id.Data4[2] = unaff_RBX[2];
      id.Data4[3] = unaff_RBX[3];
      id.Data4[4] = unaff_RBX[4];
      id.Data4[5] = unaff_RBX[5];
      id.Data4[6] = unaff_RBX[6];
      id.Data4[7] = unaff_RBX[7];
      id.Data1 = (int)in_stack_ffffffffffffffe8;
      id.Data2 = (short)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
      id.Data3 = (short)((ulong)in_stack_ffffffffffffffe8 >> 0x30);
      parent = SystemDimstyleFromId(id);
      pOVar2 = ON_ModelComponent::Id(&parent->super_ON_ModelComponent);
      bVar1 = ::operator==(pOVar2,&local_28);
      if (bVar1) {
        OverrideFields(__return_storage_ptr__,__return_storage_ptr__,parent);
      }
    }
    parent_id_00.Data4[0] = local_28.Data4[0];
    parent_id_00.Data4[1] = local_28.Data4[1];
    parent_id_00.Data4[2] = local_28.Data4[2];
    parent_id_00.Data4[3] = local_28.Data4[3];
    parent_id_00.Data4[4] = local_28.Data4[4];
    parent_id_00.Data4[5] = local_28.Data4[5];
    parent_id_00.Data4[6] = local_28.Data4[6];
    parent_id_00.Data4[7] = local_28.Data4[7];
    parent_id_00.Data1 = local_28.Data1;
    parent_id_00.Data2 = local_28.Data2;
    parent_id_00.Data3 = local_28.Data3;
    bVar1 = IsOverrideDimStyleCandidate(__return_storage_ptr__,parent_id_00,false,(ON_wString *)0x0)
    ;
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
                 ,0x14fa,"","Failed to create valid override candidate.");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_DimStyle ON_DimStyle::CreateOverrideCandidate() const
{
  ON_DimStyle override_candidate(*this);
  
  // NOTE:
  // parent_id can be nil. This allows a default constructed dimstyle to be
  // used as an override candidate.
  if ( this->IsOverrideDimStyleCandidate(ParentId(), false))
    return override_candidate;

  ON_UUID parent_id
    = override_candidate.ParentIdIsNotNil()
    ? override_candidate.ParentId()
    : override_candidate.Id();

  override_candidate.ClearId();
  override_candidate.ClearName();
  override_candidate.ClearIndex();

  if (ON_nil_uuid == parent_id)
  {
    parent_id = ON_DimStyle::Default.Id();
  }
  
  override_candidate.SetParentId(parent_id);

  if (override_candidate.HasOverrides())
  {
    const ON_DimStyle& system_parent = ON_DimStyle::SystemDimstyleFromId(parent_id);
    if (system_parent.Id() == parent_id)
      override_candidate.OverrideFields(override_candidate, system_parent);
  }

  if (false == override_candidate.IsOverrideDimStyleCandidate(parent_id, false))
  {
    ON_ERROR("Failed to create valid override candidate.");
  }

  return override_candidate;  
}